

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O3

bool __thiscall cppcms::xss::uri_parser::unreserved(uri_parser *this)

{
  byte bVar1;
  byte *pbVar2;
  
  pbVar2 = (byte *)this->begin_;
  if ((pbVar2 != (byte *)this->end_) &&
     ((((bVar1 = *pbVar2, (byte)(bVar1 - 0x30) < 10 || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) ||
       (bVar1 - 0x2d < 2)) || ((bVar1 == 0x7e || (bVar1 == 0x5f)))))) {
    this->begin_ = (char *)(pbVar2 + 1);
    return true;
  }
  return false;
}

Assistant:

bool unreserved()
		{
			if(begin_ == end_)
				return false;
			char c=*begin_;
			if(	is_alapha(c) || is_digit(c) 
				|| c=='-' || c=='.' || c=='_' || c=='~')
			{
				begin_++;
				return true;
			}
			return false;
		}